

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isLinearCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  int size;
  int size_00;
  undefined1 auVar1 [16];
  int c;
  Sampler *sampler_00;
  ConstPixelBufferAccess *access;
  bool isFixedPointDepth;
  bool bVar2;
  int iVar3;
  int i;
  int j_00;
  int j_01;
  int c_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  int j;
  Vec4 depths;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 local_b0;
  Sampler *local_a0;
  ConstPixelBufferAccess *local_98;
  TexComparePrecision *local_90;
  Vec2 local_88;
  Vec2 local_80;
  float local_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_a0 = sampler;
  local_90 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_78,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar4 = floorf(local_70 + -0.5);
  fVar5 = floorf(fStack_6c + -0.5);
  fVar6 = floorf(local_78 + -0.5);
  fVar7 = floorf(fStack_74 + -0.5);
  sampler_00 = local_a0;
  size = (level->m_size).m_data[0];
  size_00 = (level->m_size).m_data[1];
  iVar3 = (int)fVar6;
  local_98 = level;
  while (c = iVar3, c <= (int)fVar7) {
    local_68 = (float)c;
    c_00 = (int)fVar4;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    while (iVar3 = c + 1, c_00 <= (int)fVar5) {
      iVar3 = TexVerifierUtil::wrap(sampler_00->wrapS,c_00,size);
      i = TexVerifierUtil::wrap(sampler_00->wrapS,c_00 + 1,size);
      j_00 = TexVerifierUtil::wrap(sampler_00->wrapT,c,size_00);
      j_01 = TexVerifierUtil::wrap(sampler_00->wrapT,c + 1,size_00);
      access = local_98;
      fVar6 = (float)c_00;
      fVar9 = (local_70 + -0.5) - fVar6;
      fVar10 = (fStack_6c + -0.5) - fVar6;
      auVar8._4_4_ = fVar10;
      auVar8._0_4_ = fVar9;
      auVar8._8_4_ = 0.0 - fVar6;
      auVar8._12_4_ = 0.0 - fVar6;
      auVar8 = minps(_DAT_007f0910,auVar8);
      local_48 = (float)(-(uint)(0.0 <= fVar9) & auVar8._0_4_);
      fStack_44 = (float)(-(uint)(0.0 <= fVar10) & auVar8._4_4_);
      uStack_40 = -(uint)(0.0 <= 0.0 - fVar6) & auVar8._8_4_;
      uStack_3c = -(uint)(0.0 <= 0.0 - fVar6) & auVar8._12_4_;
      fVar6 = (local_78 + -0.5) - local_68;
      fVar9 = (fStack_74 + -0.5) - fStack_64;
      auVar1._4_4_ = fVar9;
      auVar1._0_4_ = fVar6;
      auVar1._8_4_ = 0.0 - fStack_60;
      auVar1._12_4_ = 0.0 - fStack_5c;
      auVar8 = minps(_DAT_007f0910,auVar1);
      local_58 = (float)(-(uint)(0.0 <= fVar6) & auVar8._0_4_);
      fStack_54 = (float)(-(uint)(0.0 <= fVar9) & auVar8._4_4_);
      uStack_50 = -(uint)(0.0 <= 0.0 - fStack_60) & auVar8._8_4_;
      uStack_4c = -(uint)(0.0 <= 0.0 - fStack_5c) & auVar8._12_4_;
      fVar6 = lookupDepth(local_98,sampler_00,iVar3,j_00,coordZ);
      fVar9 = lookupDepth(access,sampler_00,i,j_00,coordZ);
      fVar10 = lookupDepth(access,sampler_00,iVar3,j_01,coordZ);
      local_b0.m_data[3] = lookupDepth(access,sampler_00,i,j_01,coordZ);
      local_80.m_data[1] = fStack_44;
      local_80.m_data[0] = local_48;
      local_88.m_data[1] = fStack_54;
      local_88.m_data[0] = local_58;
      local_b0.m_data[0] = fVar6;
      local_b0.m_data[1] = fVar9;
      local_b0.m_data[2] = fVar10;
      bVar2 = isBilinearCompareValid
                        (sampler_00->compare,local_90,&local_b0,&local_80,&local_88,cmpReference,
                         result,isFixedPointDepth);
      c_00 = c_00 + 1;
      if (bVar2) goto LAB_007c694c;
    }
  }
LAB_007c694c:
  return c <= (int)fVar7;
}

Assistant:

static bool isLinearCompareResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const TexComparePrecision&			prec,
										const Vec2&							coord,
										const int							coordZ,
										const float							cmpReference,
										const float							result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			const Vec4	depths	(lookupDepth(level, sampler, x0, y0, coordZ),
								 lookupDepth(level, sampler, x1, y0, coordZ),
								 lookupDepth(level, sampler, x0, y1, coordZ),
								 lookupDepth(level, sampler, x1, y1, coordZ));

			if (isBilinearCompareValid(sampler.compare, prec, depths, Vec2(minA, maxA), Vec2(minB, maxB), cmpReference, result, isFixedPointDepth))
				return true;
		}
	}

	return false;
}